

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_portable.h
# Opt level: O0

void __thiscall
highwayhash::Portable::HHStatePortable::Update(HHStatePortable *this,HHPacket *packet)

{
  uint64_t uVar1;
  int local_3c;
  int lane;
  Lanes packet_lanes;
  HHPacket *packet_local;
  HHStatePortable *this_local;
  
  packet_lanes[3] = (uint64_t)packet;
  CopyPartial(*packet,0x20,&stack0xffffffffffffffc8);
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    uVar1 = host_from_le64(*(uint64_t *)(&stack0xffffffffffffffc8 + (long)local_3c * 8));
    *(uint64_t *)(&stack0xffffffffffffffc8 + (long)local_3c * 8) = uVar1;
  }
  Update(this,(Lanes *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

HH_INLINE void Update(const HHPacket& packet) {
    Lanes packet_lanes;
    CopyPartial(&packet[0], sizeof(HHPacket),
                reinterpret_cast<char*>(&packet_lanes));
    for (int lane = 0; lane < kNumLanes; ++lane) {
      packet_lanes[lane] = host_from_le64(packet_lanes[lane]);
    }
    Update(packet_lanes);
  }